

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

byte_vec_t * __thiscall
sfc::Map::native_data
          (byte_vec_t *__return_storage_ptr__,Map *this,bool column_order,uint split_w,uint split_h)

{
  bool bVar1;
  reference this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  byte_vec_t nd;
  Mapentry *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_> *__range2;
  vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_> *vm;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  local_48;
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  *local_30;
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  *__range1;
  uint local_20;
  uint split_h_local;
  uint split_w_local;
  bool column_order_local;
  Map *this_local;
  byte_vec_t *data;
  
  __range1._3_1_ = 0;
  __range1._4_4_ = split_h;
  local_20 = split_w;
  split_h_local._3_1_ = column_order;
  _split_w_local = this;
  this_local = (Map *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  collect_entries(&local_48,this,(bool)(split_h_local._3_1_ & 1),local_20,__range1._4_4_);
  local_30 = &local_48;
  __end1 = std::
           vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
           ::begin(local_30);
  vm = (vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_> *)
       std::
       vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
       ::end(local_30);
  while (bVar1 = __gnu_cxx::
                 operator==<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_*,_std::vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>_>
                           (&__end1,(__normal_iterator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_*,_std::vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>_>
                                     *)&vm), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_*,_std::vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::begin(this_00);
    m = (Mapentry *)std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<const_sfc::Mapentry_*,_std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>
                             (&__end2,(__normal_iterator<const_sfc::Mapentry_*,_std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>
                                       *)&m), ((bVar1 ^ 0xffU) & 1) != 0) {
      nd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_sfc::Mapentry_*,_std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>
                    ::operator*(&__end2);
      pack_native_mapentry
                ((byte_vec_t *)local_a8,
                 (Mapentry *)
                 nd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,this->_mode);
      local_b8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_b0,&local_b8);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 local_b0,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
      __gnu_cxx::
      __normal_iterator<const_sfc::Mapentry_*,_std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_*,_std::vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

byte_vec_t Map::native_data(bool column_order, unsigned split_w, unsigned split_h) const {
  byte_vec_t data;
  for (const auto& vm : collect_entries(column_order, split_w, split_h)) {
    for (const auto& m : vm) {
      auto nd = sfc::pack_native_mapentry(m, _mode);
      data.insert(data.end(), nd.begin(), nd.end());
    }
  }
  return data;
}